

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O2

void __thiscall
rlottie::internal::model::Property<rlottie::internal::model::PathData,_void>::Property
          (Property<rlottie::internal::model::PathData,_void> *this)

{
  _Vector_base<VPointF,_std::allocator<VPointF>_> local_28;
  undefined1 local_10;
  
  this->isValue_ = true;
  local_10 = 0;
  (this->impl_).value_.mPoints.super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->impl_).value_.mPoints.super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->impl_).value_.mPoints.super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->impl_).value_.mClosed = false;
  std::_Vector_base<VPointF,_std::allocator<VPointF>_>::~_Vector_base(&local_28);
  return;
}

Assistant:

Property() { construct(impl_.value_, {}); }